

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O0

char * iniparser_getsecname(dictionary *d,int n)

{
  char *pcVar1;
  int local_2c;
  ulong uStack_28;
  int foundsec;
  size_t i;
  int n_local;
  dictionary *d_local;
  
  if ((d == (dictionary *)0x0) || (n < 0)) {
    d_local = (dictionary *)0x0;
  }
  else {
    local_2c = 0;
    uStack_28 = 0;
    while ((uStack_28 < (ulong)d->size &&
           (((d->key[uStack_28] == (char *)0x0 ||
             (pcVar1 = strchr(d->key[uStack_28],0x3a), pcVar1 != (char *)0x0)) ||
            (local_2c = local_2c + 1, local_2c <= n))))) {
      uStack_28 = uStack_28 + 1;
    }
    if (n < local_2c) {
      d_local = (dictionary *)d->key[uStack_28];
    }
    else {
      d_local = (dictionary *)0x0;
    }
  }
  return (char *)d_local;
}

Assistant:

const char * iniparser_getsecname(const dictionary * d, int n)
{
    size_t i ;
    int foundsec ;

    if (d==NULL || n<0) return NULL ;
    foundsec=0 ;
    for (i=0 ; i<d->size ; i++) {
        if (d->key[i]==NULL)
            continue ;
        if (strchr(d->key[i], ':')==NULL) {
            foundsec++ ;
            if (foundsec>n)
                break ;
        }
    }
    if (foundsec<=n) {
        return NULL ;
    }
    return d->key[i] ;
}